

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Diagnostic * __thiscall slang::ast::Compilation::addDiag(Compilation *this,Diagnostic *diag)

{
  _Storage<unsigned_long,_true> _Var1;
  SourceLocation SVar2;
  optional<unsigned_long> *poVar3;
  undefined4 uVar4;
  undefined7 uVar5;
  bool bVar6;
  Symbol *pSVar7;
  Diagnostic *pDVar8;
  bool isNew;
  bool local_99;
  Diagnostic local_98;
  
  if (this->diagsDisabled == true) {
LAB_003dfaf2:
    pDVar8 = &this->tempDiag;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::_M_move_assign(&pDVar8->args,diag);
    std::vector<slang::SourceRange,_std::allocator<slang::SourceRange>_>::_M_move_assign
              (&(this->tempDiag).ranges,&diag->ranges);
    std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::_M_move_assign
              (&(this->tempDiag).notes,&diag->notes);
    (this->tempDiag).symbol = diag->symbol;
    _Var1 = (diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload;
    bVar6 = (diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged;
    uVar5 = *(undefined7 *)
             &(diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>.field_0x9;
    uVar4 = *(undefined4 *)&diag->field_0x5c;
    SVar2 = diag->location;
    (this->tempDiag).code = diag->code;
    *(undefined4 *)&(this->tempDiag).field_0x5c = uVar4;
    (this->tempDiag).location = SVar2;
    (this->tempDiag).coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload = _Var1;
    poVar3 = &(this->tempDiag).coalesceCount;
    (poVar3->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = bVar6;
    *(undefined7 *)
     &(poVar3->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_long>.field_0x9 = uVar5;
  }
  else {
    pSVar7 = diag->symbol;
    while (pSVar7 != (Symbol *)0x0) {
      if (pSVar7->kind == GenerateBlock) {
        if (*(char *)((long)&pSVar7[1].originatingSyntax + 4) != '\0') goto LAB_003dfaf2;
        break;
      }
      if (pSVar7->parentScope == (Scope *)0x0) {
        pSVar7 = (Symbol *)0x0;
      }
      else {
        pSVar7 = pSVar7->parentScope->thisSym;
      }
    }
    bVar6 = Diagnostic::isError(diag);
    local_98.args.
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (diag->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_98.args.
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (diag->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_98.args.
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (diag->args).
         super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (diag->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (diag->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (diag->args).
    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (diag->ranges).super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl
    .super__Vector_impl_data._M_start =
         (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (diag->notes).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.symbol = diag->symbol;
    local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
         (diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._9_7_ =
         *(undefined7 *)
          &(diag->coalesceCount).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>.field_0x9;
    local_98.code = diag->code;
    local_98._92_4_ = *(undefined4 *)&diag->field_0x5c;
    local_98.location = diag->location;
    pDVar8 = ASTDiagMap::add(&this->diagMap,&local_98,&local_99);
    std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_98.notes);
    if (local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.ranges.
                      super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.ranges.
                            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.ranges.
                            super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::~vector(&local_98.args);
    if ((bVar6 & local_99) == 1) {
      this->numErrors = this->numErrors + 1;
    }
  }
  return pDVar8;
}

Assistant:

Diagnostic& Compilation::addDiag(Diagnostic diag) {
    SLANG_ASSERT(!isFrozen());

    if (diagsDisabled) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    auto isSuppressed = [](const Symbol* symbol) {
        while (symbol) {
            if (symbol->kind == SymbolKind::GenerateBlock)
                return symbol->as<GenerateBlockSymbol>().isUninstantiated;

            auto scope = symbol->getParentScope();
            symbol = scope ? &scope->asSymbol() : nullptr;
        }
        return false;
    };

    // Filter out diagnostics that came from inside an uninstantiated generate block.
    SLANG_ASSERT(diag.symbol);
    SLANG_ASSERT(diag.location);
    if (isSuppressed(diag.symbol)) {
        tempDiag = std::move(diag);
        return tempDiag;
    }

    const bool isError = diag.isError();

    bool isNew;
    auto& result = diagMap.add(std::move(diag), isNew);
    if (isNew && isError)
        numErrors++;

    return result;
}